

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool wabt::anon_unknown_1::ResolveFuncTypeWithEmptySignature(Module *module,FuncDeclaration *decl)

{
  bool bVar1;
  FuncType *pFVar2;
  
  if (decl->has_func_type == true) {
    bVar1 = false;
    if (((decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       (bVar1 = false,
       (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      pFVar2 = Module::GetFuncType(module,&decl->type_var);
      if (pFVar2 == (FuncType *)0x0) {
        bVar1 = false;
      }
      else {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&(decl->sig).param_types,&(pFVar2->sig).param_types);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                  (&(decl->sig).result_types,&(pFVar2->sig).result_types);
        bVar1 = true;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ResolveFuncTypeWithEmptySignature(const Module& module,
                                       FuncDeclaration* decl) {
  // Resolve func type variables where the signature was not specified
  // explicitly, e.g.: (func (type 1) ...)
  if (decl->has_func_type && IsEmptySignature(decl->sig)) {
    const FuncType* func_type = module.GetFuncType(decl->type_var);
    if (func_type) {
      decl->sig = func_type->sig;
      return true;
    }
  }
  return false;
}